

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

obj * some_armor(monst *victim)

{
  uint uVar1;
  obj *poVar2;
  obj *poVar3;
  
  poVar2 = uarmc;
  if (victim != &youmonst) {
    poVar2 = which_armor(victim,2);
  }
  if ((poVar2 == (obj *)0x0) && (poVar2 = uarm, victim != &youmonst)) {
    poVar2 = which_armor(victim,1);
  }
  if ((poVar2 == (obj *)0x0) && (poVar2 = uarmu, victim != &youmonst)) {
    poVar2 = which_armor(victim,0x40);
  }
  poVar3 = uarmh;
  if (victim != &youmonst) {
    poVar3 = which_armor(victim,4);
  }
  if ((poVar3 != (obj *)0x0) && ((poVar2 == (obj *)0x0 || (uVar1 = mt_random(), (uVar1 & 3) == 0))))
  {
    poVar2 = poVar3;
  }
  poVar3 = uarmg;
  if (victim != &youmonst) {
    poVar3 = which_armor(victim,0x10);
  }
  if ((poVar3 != (obj *)0x0) && ((poVar2 == (obj *)0x0 || (uVar1 = mt_random(), (uVar1 & 3) == 0))))
  {
    poVar2 = poVar3;
  }
  poVar3 = uarmf;
  if (victim != &youmonst) {
    poVar3 = which_armor(victim,0x20);
  }
  if ((poVar3 != (obj *)0x0) && ((poVar2 == (obj *)0x0 || (uVar1 = mt_random(), (uVar1 & 3) == 0))))
  {
    poVar2 = poVar3;
  }
  poVar3 = uarms;
  if (victim != &youmonst) {
    poVar3 = which_armor(victim,8);
  }
  if ((poVar3 != (obj *)0x0) && ((poVar2 == (obj *)0x0 || (uVar1 = mt_random(), (uVar1 & 3) == 0))))
  {
    poVar2 = poVar3;
  }
  return poVar2;
}

Assistant:

struct obj *some_armor(struct monst *victim)
{
	struct obj *otmph, *otmp;

	otmph = (victim == &youmonst) ? uarmc : which_armor(victim, W_ARMC);
	if (!otmph)
	    otmph = (victim == &youmonst) ? uarm : which_armor(victim, W_ARM);
	if (!otmph)
	    otmph = (victim == &youmonst) ? uarmu : which_armor(victim, W_ARMU);
	
	otmp = (victim == &youmonst) ? uarmh : which_armor(victim, W_ARMH);
	if (otmp && (!otmph || !rn2(4))) otmph = otmp;
	otmp = (victim == &youmonst) ? uarmg : which_armor(victim, W_ARMG);
	if (otmp && (!otmph || !rn2(4))) otmph = otmp;
	otmp = (victim == &youmonst) ? uarmf : which_armor(victim, W_ARMF);
	if (otmp && (!otmph || !rn2(4))) otmph = otmp;
	otmp = (victim == &youmonst) ? uarms : which_armor(victim, W_ARMS);
	if (otmp && (!otmph || !rn2(4))) otmph = otmp;
	return otmph;
}